

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O1

bool __thiscall Table::in_delimiter(Table *this,char *ch)

{
  bool bVar1;
  string s;
  string local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::push_back((char)&local_38);
  bVar1 = in_delimiter(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool Table::in_delimiter(const char &ch) {
    std::string s;
    s.push_back(ch);
    return in_delimiter(s);
}